

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Proc_topology(int g_a,int proc,int *coord)

{
  Integer IVar1;
  long lVar2;
  Integer _ga_work [7];
  Integer local_58 [7];
  
  IVar1 = pnga_ndim((long)g_a);
  pnga_proc_topology((long)g_a,(long)proc,local_58);
  lVar2 = 0;
  if (IVar1 < 1) {
    IVar1 = lVar2;
  }
  for (; IVar1 != lVar2; lVar2 = lVar2 + 1) {
    coord[lVar2] = (int)local_58[lVar2];
  }
  return;
}

Assistant:

void NGA_Proc_topology(int g_a, int proc, int coord[])
{
     Integer a=(Integer)g_a;
     Integer p=(Integer)proc;
     Integer ndim = wnga_ndim(a);
     Integer _ga_work[MAXDIM];
     wnga_proc_topology(a, p, _ga_work);
     COPY(int,_ga_work, coord,ndim);  
}